

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDReplace
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,SIMDReplace *curr)

{
  array<wasm::Literal,_1UL> *this_00;
  Flow *pFVar1;
  Literal *value_00;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_188;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  undefined1 local_d8 [8];
  Literal value;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_b8;
  size_t local_a0;
  char *pcStack_98;
  Flow local_90;
  undefined1 local_48 [8];
  Literal vec;
  
  visit(&local_90,this,*(Expression **)(curr + 0x18));
  if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
    if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) {
LAB_001242de:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    this_00 = &local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed;
    wasm::Literal::Literal((Literal *)local_48,this_00->_M_elems);
    visit((Flow *)local_d8,this,*(Expression **)(curr + 0x28));
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = (size_t)local_d8;
    wasm::Literal::operator=(this_00->_M_elems,&value);
    local_188.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_188.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_188.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_188);
    local_90.breakTo.super_IString.str._M_len = local_a0;
    local_90.breakTo.super_IString.str._M_str = pcStack_98;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_b8);
    wasm::Literal::~Literal(&value);
    if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
      if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) goto LAB_001242de;
      wasm::Literal::Literal((Literal *)local_d8,this_00->_M_elems);
      switch(*(undefined4 *)(curr + 0x10)) {
      case 0:
        value_00 = &local_168;
        wasm::Literal::replaceLaneI8x16(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      case 1:
        value_00 = &local_150;
        wasm::Literal::replaceLaneI16x8(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      case 2:
        value_00 = &local_138;
        wasm::Literal::replaceLaneI32x4(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      case 3:
        value_00 = &local_120;
        wasm::Literal::replaceLaneI64x2(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      case 4:
        value_00 = &local_108;
        wasm::Literal::replaceLaneF32x4(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      case 5:
        value_00 = &local_f0;
        wasm::Literal::replaceLaneF64x2(value_00,(uchar)local_48);
        Flow::Flow(__return_storage_ptr__,value_00);
        break;
      default:
        wasm::handle_unreachable
                  ("invalid op",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x437);
      }
      wasm::Literal::~Literal(value_00);
      wasm::Literal::~Literal((Literal *)local_d8);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,this_00->_M_elems);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           local_90.breakTo.super_IString.str._M_len;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           local_90.breakTo.super_IString.str._M_str;
    }
    wasm::Literal::~Literal((Literal *)local_48);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         local_90.breakTo.super_IString.str._M_len;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         local_90.breakTo.super_IString.str._M_str;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            (&local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
  pFVar1 = (Flow *)wasm::Literal::~Literal
                             (local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  return pFVar1;
}

Assistant:

Flow visitSIMDReplace(SIMDReplace* curr) {
    NOTE_ENTER("SIMDReplace");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        return vec.replaceLaneI8x16(value, curr->index);
      case ReplaceLaneVecI16x8:
        return vec.replaceLaneI16x8(value, curr->index);
      case ReplaceLaneVecI32x4:
        return vec.replaceLaneI32x4(value, curr->index);
      case ReplaceLaneVecI64x2:
        return vec.replaceLaneI64x2(value, curr->index);
      case ReplaceLaneVecF32x4:
        return vec.replaceLaneF32x4(value, curr->index);
      case ReplaceLaneVecF64x2:
        return vec.replaceLaneF64x2(value, curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }